

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gtest-param-util.h
# Opt level: O0

Test * __thiscall
testing::internal::
ParameterizedTestFactory<(anonymous_namespace)::CDEFFindDirTest_TestSIMDNoMismatch_Test>::CreateTest
          (ParameterizedTestFactory<(anonymous_namespace)::CDEFFindDirTest_TestSIMDNoMismatch_Test>
           *this)

{
  Test *this_00;
  long in_RDI;
  
  WithParamInterface<std::tuple<int_(*)(const_unsigned_short_*,_int,_int_*,_int),_int_(*)(const_unsigned_short_*,_int,_int_*,_int)>_>
  ::SetParam((ParamType *)(in_RDI + 8));
  this_00 = (Test *)operator_new(0x28);
  anon_unknown.dwarf_108b30::CDEFFindDirTest_TestSIMDNoMismatch_Test::
  CDEFFindDirTest_TestSIMDNoMismatch_Test((CDEFFindDirTest_TestSIMDNoMismatch_Test *)this_00);
  return this_00;
}

Assistant:

Test* CreateTest() override {
    TestClass::SetParam(&parameter_);
    return new TestClass();
  }